

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

VOID ExitThread(DWORD dwExitCode)

{
  CPalThread *this;
  CPalThread *pThread;
  DWORD dwExitCode_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  this = CorUnix::InternalGetCurrentThread();
  CorUnix::CPalThread::SetExitCode(this,dwExitCode);
  PAL_Leave(PAL_BoundaryTop);
  pthread_exit((void *)0x0);
}

Assistant:

PAL_NORETURN
VOID
PALAPI
ExitThread(
       IN DWORD dwExitCode)
{
    CPalThread *pThread;

    ENTRY("ExitThread(dwExitCode=%u)\n", dwExitCode);
    PERF_ENTRY_ONLY(ExitThread);

    pThread = InternalGetCurrentThread();

    /* store the exit code */
    pThread->SetExitCode(dwExitCode);

    /* pthread_exit runs TLS destructors and cleanup routines,
       possibly registered by foreign code.  The right thing
       to do here is to leave the PAL.  Our own TLS destructor
       re-enters us explicitly. */
    PAL_Leave(PAL_BoundaryTop);

    /* kill the thread (itself), resulting in a call to InternalEndCurrentThread */
    pthread_exit(NULL);

    ASSERT("pthread_exit should not return!\n");
    while (true);
}